

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O0

__pid_t __thiscall PixelToaster::UnixTimer::wait(UnixTimer *this,void *__stat_loc)

{
  __pid_t _Var1;
  double seconds_local;
  UnixTimer *this_local;
  
  _Var1 = internal::wait(this);
  return _Var1;
}

Assistant:

void wait(double seconds)
    {
        internal::wait(seconds);
    }